

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::torrent::add_hashes
          (torrent *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  piece_index_t pVar1;
  hash_picker *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var2;
  bool bVar3;
  pointer ppVar4;
  pointer psVar5;
  add_hashes_result result;
  add_hashes_result local_80;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  need_hash_picker(this);
  this_00 = (this->super_torrent_hot_members).m_hash_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (this_00 == (hash_picker *)0x0) {
    local_80.valid = true;
  }
  else {
    hash_picker::add_hashes(&local_80,this_00,req,(span<const_libtorrent::digest32<256L>_>)hashes);
    for (ppVar4 = local_80.hash_failed.
                  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = local_80.hash_passed.
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        ppVar4 != local_80.hash_failed.
                  super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      bVar3 = info_hash_t::has_v1(&((this->super_torrent_hot_members).m_torrent_file.
                                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_info_hash);
      if ((bVar3) && (bVar3 = have_piece(this,(piece_index_t)(ppVar4->first).m_val), bVar3)) {
        handle_inconsistent_hashes(this,(piece_index_t)(ppVar4->first).m_val);
        goto LAB_002e0f3d;
      }
      _Var2._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if ((_Var2._M_head_impl != (piece_picker *)0x0) &&
         (pVar1.m_val = (ppVar4->first).m_val,
         (*(uint *)(*(long *)&(_Var2._M_head_impl)->m_piece_map + (long)pVar1.m_val * 8) &
         0x1c000000) != 0x10000000)) {
        ::std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_48,&ppVar4->second);
        piece_failed(this,pVar1,(vector<int,_std::allocator<int>_> *)&local_48);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      }
    }
    for (; psVar5 != local_80.hash_passed.
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      pVar1.m_val = psVar5->m_val;
      bVar3 = info_hash_t::has_v1(&((this->super_torrent_hot_members).m_torrent_file.
                                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_info_hash);
      if ((bVar3) && (bVar3 = have_piece(this,pVar1), !bVar3)) {
        handle_inconsistent_hashes(this,pVar1);
        break;
      }
      _Var2._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if ((((_Var2._M_head_impl != (piece_picker *)0x0) &&
           ((*(uint *)(*(long *)&(_Var2._M_head_impl)->m_piece_map + (long)pVar1.m_val * 8) &
            0x1c000000) != 0x10000000)) &&
          (bVar3 = piece_picker::is_piece_finished(_Var2._M_head_impl,pVar1), bVar3)) &&
         (bVar3 = piece_picker::is_hashing
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,pVar1), !bVar3)) {
        piece_passed(this,pVar1);
      }
    }
LAB_002e0f3d:
    add_hashes_result::~add_hashes_result(&local_80);
  }
  return local_80.valid;
}

Assistant:

bool torrent::add_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		need_hash_picker();
		if (!m_hash_picker) return true;
		add_hashes_result const result = m_hash_picker->add_hashes(req, hashes);
		for (auto& p : result.hash_failed)
		{
			if (torrent_file().info_hashes().has_v1() && have_piece(p.first))
			{
				handle_inconsistent_hashes(p.first);
				return result.valid;
			}

			TORRENT_ASSERT(!have_piece(p.first));

			// the piece may not have been downloaded in this session
			// it should be open for downloading so nothing needs to be done here
			if (!m_picker || !m_picker->is_downloading(p.first)) continue;
			piece_failed(p.first, p.second);
		}
		for (piece_index_t p : result.hash_passed)
		{
			if (torrent_file().info_hashes().has_v1() && !have_piece(p))
			{
				handle_inconsistent_hashes(p);
				return result.valid;
			}

			if (m_picker && m_picker->is_downloading(p) && m_picker->is_piece_finished(p)
				&& !m_picker->is_hashing(p))
			{
				piece_passed(p);
			}
		}
		return result.valid;
	}